

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Stream.cc
# Opt level: O2

bool __thiscall
qpdf::Stream::pipeStreamData
          (Stream *this,Pipeline *pipeline,bool *filterp,int encode_flags,
          qpdf_stream_decode_level_e decode_level,bool suppress_warnings,bool will_retry)

{
  element_type *peVar1;
  Buffer *this_00;
  element_type *peVar2;
  element_type *peVar3;
  long offset;
  QPDF *qpdf;
  QPDFObjGen og;
  Stream *pSVar4;
  Pipeline *pPVar5;
  char cVar6;
  bool is_root_metadata;
  byte bVar7;
  bool bVar8;
  int iVar9;
  Members *pMVar10;
  undefined4 extraout_var;
  Pl_Flate *this_01;
  uchar *puVar11;
  size_t sVar12;
  qpdf_offset_t __val;
  longlong __val_00;
  runtime_error *this_02;
  logic_error *this_03;
  pointer psVar13;
  undefined7 in_register_00000089;
  pointer psVar14;
  ulong uVar15;
  QPDFObjectHandle *key;
  bool local_250;
  bool lossy_compression;
  bool specialized_compression;
  Pipeline *pipeline_local;
  Stream *local_240;
  string local_238;
  undefined4 local_214;
  Members *local_210;
  shared_ptr<Pipeline> new_pipeline;
  Pl_Count count;
  shared_ptr<ContentNormalizer> normalizer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  vector<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_> to_delete;
  vector<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>
  filters;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_148;
  _Any_data local_138;
  code *local_128;
  code *local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  QPDFObjGen local_f8;
  string local_f0;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_214 = (undefined4)CONCAT71(in_register_00000089,suppress_warnings);
  pipeline_local = pipeline;
  pMVar10 = stream(this);
  filters.
  super__Vector_base<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  filters.
  super__Vector_base<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  filters.
  super__Vector_base<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  specialized_compression = false;
  lossy_compression = false;
  if (filterp != (bool *)0x0) {
    *filterp = decode_level != qpdf_dl_none || encode_flags != 0;
  }
  if (decode_level == qpdf_dl_none && encode_flags == 0) {
    local_250 = false;
LAB_001c5e0b:
    bVar8 = local_250;
    if (pipeline_local == (Pipeline *)0x0) {
      if (filterp == (bool *)0x0) goto LAB_001c6578;
LAB_001c5fc8:
      local_250 = *filterp;
      goto LAB_001c6578;
    }
  }
  else {
    local_250 = filterable(this,&filters,&specialized_compression,&lossy_compression);
    if (filterp != (bool *)0x0) {
      *filterp = local_250;
      local_250 = true;
    }
    if (2 < (int)decode_level) goto LAB_001c5e0b;
    bVar8 = false;
    if (lossy_compression == false) {
      bVar8 = local_250;
    }
    if (lossy_compression == true && filterp != (bool *)0x0) {
      *filterp = false;
      bVar8 = local_250;
    }
    local_250 = bVar8;
    if ((decode_level == qpdf_dl_specialized) || (specialized_compression != true))
    goto LAB_001c5e0b;
    if (filterp != (bool *)0x0) {
      *filterp = false;
      bVar8 = local_250;
      if (pipeline_local != (Pipeline *)0x0) goto LAB_001c5e17;
      goto LAB_001c5fc8;
    }
    local_250 = false;
    bVar8 = local_250;
    local_250 = false;
    if (pipeline_local == (Pipeline *)0x0) goto LAB_001c6578;
  }
LAB_001c5e17:
  local_250 = bVar8;
  to_delete.
  super__Vector_base<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  to_delete.
  super__Vector_base<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  to_delete.
  super__Vector_base<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  normalizer.super___shared_ptr<ContentNormalizer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  normalizer.super___shared_ptr<ContentNormalizer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  new_pipeline.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  new_pipeline.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cVar6 = local_250;
  if (filterp != (bool *)0x0) {
    cVar6 = *filterp;
  }
  local_240 = this;
  local_210 = pMVar10;
  if (cVar6 != '\0') {
    if ((encode_flags & 1U) != 0) {
      local_238._M_dataplus._M_p._0_4_ = 1;
      std::make_shared<Pl_Flate,char_const(&)[16],Pipeline*&,Pl_Flate::action_e>
                ((char (*) [16])&count,(Pipeline **)"compress stream",(action_e *)&pipeline_local);
      std::__shared_ptr<Pipeline,(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<Pipeline,(__gnu_cxx::_Lock_policy)2> *)&new_pipeline,
                 (__shared_ptr<Pl_Flate,_(__gnu_cxx::_Lock_policy)2> *)&count);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&count.super_Pipeline.identifier);
      std::vector<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>::push_back
                (&to_delete,(value_type *)&new_pipeline);
      pipeline_local = new_pipeline.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    if ((encode_flags & 2U) != 0) {
      std::make_shared<ContentNormalizer>();
      std::__shared_ptr<ContentNormalizer,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&normalizer.super___shared_ptr<ContentNormalizer,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<ContentNormalizer,_(__gnu_cxx::_Lock_policy)2> *)&count);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&count.super_Pipeline.identifier);
      local_238._M_dataplus._M_p =
           (pointer)normalizer.super___shared_ptr<ContentNormalizer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
      std::make_shared<Pl_QPDFTokenizer,char_const(&)[11],ContentNormalizer*,Pipeline*&>
                ((char (*) [11])&count,(ContentNormalizer **)"normalizer",(Pipeline **)&local_238);
      std::__shared_ptr<Pipeline,(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<Pipeline,(__gnu_cxx::_Lock_policy)2> *)&new_pipeline,
                 (__shared_ptr<Pl_QPDFTokenizer,_(__gnu_cxx::_Lock_policy)2> *)&count);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&count.super_Pipeline.identifier);
      std::vector<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>::push_back
                (&to_delete,(value_type *)&new_pipeline);
      pipeline_local = new_pipeline.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    for (psVar14 = (pMVar10->token_filters).
                   super__Vector_base<std::shared_ptr<QPDFObjectHandle::TokenFilter>,_std::allocator<std::shared_ptr<QPDFObjectHandle::TokenFilter>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        psVar14 !=
        (local_210->token_filters).
        super__Vector_base<std::shared_ptr<QPDFObjectHandle::TokenFilter>,_std::allocator<std::shared_ptr<QPDFObjectHandle::TokenFilter>_>_>
        ._M_impl.super__Vector_impl_data._M_start; psVar14 = psVar14 + -1) {
      local_238._M_dataplus._M_p =
           (pointer)psVar14[-1].
                    super___shared_ptr<QPDFObjectHandle::TokenFilter,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
      std::make_shared<Pl_QPDFTokenizer,char_const(&)[13],QPDFObjectHandle::TokenFilter*,Pipeline*&>
                ((char (*) [13])&count,(TokenFilter **)"token filter",(Pipeline **)&local_238);
      std::__shared_ptr<Pipeline,(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<Pipeline,(__gnu_cxx::_Lock_policy)2> *)&new_pipeline,
                 (__shared_ptr<Pl_QPDFTokenizer,_(__gnu_cxx::_Lock_policy)2> *)&count);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&count.super_Pipeline.identifier);
      std::vector<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>::push_back
                (&to_delete,(value_type *)&new_pipeline);
      pipeline_local = new_pipeline.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    psVar13 = filters.
              super__Vector_base<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    while (psVar13 !=
           filters.
           super__Vector_base<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>
           ._M_impl.super__Vector_impl_data._M_start) {
      peVar1 = psVar13[-1].super___shared_ptr<QPDFStreamFilter,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      iVar9 = (*peVar1->_vptr_QPDFStreamFilter[3])(peVar1,pipeline_local);
      psVar13 = psVar13 + -1;
      pPVar5 = (Pipeline *)CONCAT44(extraout_var,iVar9);
      if ((((Pipeline *)CONCAT44(extraout_var,iVar9) != (Pipeline *)0x0) ||
          (pPVar5 = pipeline_local, pipeline_local != (Pipeline *)0x0)) &&
         (pipeline_local = pPVar5,
         this_01 = (Pl_Flate *)
                   __dynamic_cast(pipeline_local,&Pipeline::typeinfo,&Pl_Flate::typeinfo,0),
         this_01 != (Pl_Flate *)0x0)) {
        local_138._8_8_ = 0;
        local_138._M_unused._M_object = local_240;
        local_120 = std::
                    _Function_handler<void_(const_char_*,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDF_Stream.cc:483:40)>
                    ::_M_invoke;
        local_128 = std::
                    _Function_handler<void_(const_char_*,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDF_Stream.cc:483:40)>
                    ::_M_manager;
        Pl_Flate::setWarnCallback(this_01,(function<void_(const_char_*,_int)> *)&local_138);
        std::_Function_base::~_Function_base((_Function_base *)&local_138);
      }
    }
  }
  pMVar10 = local_210;
  pSVar4 = local_240;
  pPVar5 = pipeline_local;
  this_00 = (local_210->stream_data).super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 == (Buffer *)0x0) {
    bVar8 = (bool)(byte)local_214;
    uVar15 = (ulong)(byte)local_214;
    if ((local_210->stream_provider).
        super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        != (element_type *)0x0) {
      Pl_Count::Pl_Count(&count,"stream provider count",pipeline_local);
      pSVar4 = local_240;
      bVar8 = QPDFObjectHandle::StreamDataProvider::supportsRetry
                        ((pMVar10->stream_provider).
                         super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
      peVar2 = (pMVar10->stream_provider).
               super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if (bVar8) {
        local_238._M_dataplus._M_p =
             *(pointer *)
              &((pSVar4->super_BaseHandle).obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->og;
        iVar9 = (*peVar2->_vptr_StreamDataProvider[3])
                          (peVar2,&local_238,&count,uVar15,(ulong)will_retry);
        cVar6 = (char)iVar9;
        bVar8 = false;
        if (cVar6 != '\0') {
          bVar8 = local_250;
        }
        if (filterp != (bool *)0x0 && cVar6 == '\0') {
          *filterp = false;
          cVar6 = '\0';
          bVar8 = local_250;
        }
      }
      else {
        local_238._M_dataplus._M_p =
             *(pointer *)
              &((pSVar4->super_BaseHandle).obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->og;
        (*peVar2->_vptr_StreamDataProvider[2])(peVar2,&local_238,&count);
        cVar6 = '\x01';
        bVar8 = local_250;
      }
      local_250 = bVar8;
      __val = Pl_Count::getCount(&count);
      if (cVar6 != '\0') {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_238,"/Length",(allocator<char> *)&local_1a8);
        key = &pMVar10->stream_dict;
        bVar8 = QPDFObjectHandle::hasKey(key,&local_238);
        std::__cxx11::string::~string((string *)&local_238);
        if (bVar8) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_238,"/Length",(allocator<char> *)&local_118);
          QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_1a8,(string *)key);
          __val_00 = QPDFObjectHandle::getIntValue((QPDFObjectHandle *)&local_1a8);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1a8._M_string_length);
          std::__cxx11::string::~string((string *)&local_238);
          if (__val != __val_00) {
            this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_f8 = ((local_240->super_BaseHandle).obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->og;
            QPDFObjGen::unparse_abi_cxx11_(&local_b0,&local_f8,' ');
            std::operator+(&local_90,"stream data provider for ",&local_b0);
            std::operator+(&local_70,&local_90," provided ");
            std::__cxx11::to_string(&local_d0,__val);
            std::operator+(&local_50,&local_70,&local_d0);
            std::operator+(&local_118,&local_50," bytes instead of expected ");
            std::__cxx11::to_string(&local_f0,__val_00);
            std::operator+(&local_1a8,&local_118,&local_f0);
            std::operator+(&local_238,&local_1a8," bytes");
            std::runtime_error::runtime_error(this_02,(string *)&local_238);
            __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_238,"/Length",(allocator<char> *)&local_118);
          QPDFObjectHandle::newInteger((longlong)pipeline_local);
          QPDFObjectHandle::replaceKey(key,&local_238,(QPDFObjectHandle *)&local_1a8);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1a8._M_string_length);
          std::__cxx11::string::~string((string *)&local_238);
        }
      }
      Pl_Count::~Pl_Count(&count);
      goto LAB_001c6472;
    }
    peVar3 = (local_240->super_BaseHandle).obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    offset = peVar3->parsed_offset;
    if (offset == 0) {
      this_03 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this_03,"pipeStreamData called for stream with no data");
      __cxa_throw(this_03,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    qpdf = peVar3->qpdf;
    og = peVar3->og;
    sVar12 = local_210->length;
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_148,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_210->stream_dict);
    is_root_metadata = isRootMetadata(pSVar4);
    bVar8 = QPDF::Pipe::pipeStreamData
                      (qpdf,og,offset,sVar12,(QPDFObjectHandle *)&local_148,is_root_metadata,
                       pipeline_local,bVar8,will_retry);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_148._M_refcount);
    cVar6 = '\x01';
    if (bVar8) goto LAB_001c6472;
    if (filterp != (bool *)0x0) {
      *filterp = false;
    }
    local_250 = false;
  }
  else {
    puVar11 = Buffer::getBuffer(this_00);
    sVar12 = Buffer::getSize((pMVar10->stream_data).
                             super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    (*pPVar5->_vptr_Pipeline[2])(pPVar5,puVar11,sVar12);
    cVar6 = '\x01';
    (*pipeline_local->_vptr_Pipeline[3])();
LAB_001c6472:
    if (filterp != (bool *)0x0) {
      local_250 = *filterp;
    }
    bVar7 = ~local_250;
    local_250 = (bool)cVar6;
    if (((((bVar7 | (byte)local_214) & 1) == 0) &&
        (normalizer.super___shared_ptr<ContentNormalizer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
         (element_type *)0x0)) &&
       (bVar8 = ContentNormalizer::anyBadTokens
                          (normalizer.
                           super___shared_ptr<ContentNormalizer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
       , bVar8)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&count,"content normalization encountered bad tokens",
                 (allocator<char> *)&local_238);
      warn(local_240,(string *)&count);
      std::__cxx11::string::~string((string *)&count);
      bVar8 = ContentNormalizer::lastTokenWasBad
                        (normalizer.
                         super___shared_ptr<ContentNormalizer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      pSVar4 = local_240;
      if (bVar8) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&count,
                   "normalized content ended with a bad token; you may be able to resolve this by coalescing content streams in combination with normalizing content. From the command line, specify --coalesce-contents"
                   ,(allocator<char> *)&local_238);
        warn(pSVar4,(string *)&count);
        std::__cxx11::string::~string((string *)&count);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&count,
                 "Resulting stream data may be corrupted but is may still useful for manual inspection. For more information on this warning, search for content normalization in the manual."
                 ,(allocator<char> *)&local_238);
      warn(pSVar4,(string *)&count);
      std::__cxx11::string::~string((string *)&count);
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&new_pipeline.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&normalizer.super___shared_ptr<ContentNormalizer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::vector<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>::~vector
            (&to_delete);
LAB_001c6578:
  std::
  vector<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>::
  ~vector(&filters);
  return local_250;
}

Assistant:

bool
Stream::pipeStreamData(
    Pipeline* pipeline,
    bool* filterp,
    int encode_flags,
    qpdf_stream_decode_level_e decode_level,
    bool suppress_warnings,
    bool will_retry)
{
    auto s = stream();
    std::vector<std::shared_ptr<QPDFStreamFilter>> filters;
    bool specialized_compression = false;
    bool lossy_compression = false;
    bool ignored;
    if (filterp == nullptr) {
        filterp = &ignored;
    }
    bool& filter = *filterp;
    filter = (!((encode_flags == 0) && (decode_level == qpdf_dl_none)));
    bool success = true;
    if (filter) {
        filter = filterable(filters, specialized_compression, lossy_compression);
        if ((decode_level < qpdf_dl_all) && lossy_compression) {
            filter = false;
        }
        if ((decode_level < qpdf_dl_specialized) && specialized_compression) {
            filter = false;
        }
        QTC::TC(
            "qpdf",
            "QPDF_Stream special filters",
            (!filter)                     ? 0
                : lossy_compression       ? 1
                : specialized_compression ? 2
                                          : 3);
    }

    if (pipeline == nullptr) {
        QTC::TC("qpdf", "QPDF_Stream pipeStreamData with null pipeline");
        // Return value is whether we can filter in this case.
        return filter;
    }

    // Construct the pipeline in reverse order. Force pipelines we create to be deleted when this
    // function finishes. Pipelines created by QPDFStreamFilter objects will be deleted by those
    // objects.
    std::vector<std::shared_ptr<Pipeline>> to_delete;

    std::shared_ptr<ContentNormalizer> normalizer;
    std::shared_ptr<Pipeline> new_pipeline;
    if (filter) {
        if (encode_flags & qpdf_ef_compress) {
            new_pipeline =
                std::make_shared<Pl_Flate>("compress stream", pipeline, Pl_Flate::a_deflate);
            to_delete.push_back(new_pipeline);
            pipeline = new_pipeline.get();
        }

        if (encode_flags & qpdf_ef_normalize) {
            normalizer = std::make_shared<ContentNormalizer>();
            new_pipeline =
                std::make_shared<Pl_QPDFTokenizer>("normalizer", normalizer.get(), pipeline);
            to_delete.push_back(new_pipeline);
            pipeline = new_pipeline.get();
        }

        for (auto iter = s->token_filters.rbegin(); iter != s->token_filters.rend(); ++iter) {
            new_pipeline =
                std::make_shared<Pl_QPDFTokenizer>("token filter", (*iter).get(), pipeline);
            to_delete.push_back(new_pipeline);
            pipeline = new_pipeline.get();
        }

        for (auto f_iter = filters.rbegin(); f_iter != filters.rend(); ++f_iter) {
            auto decode_pipeline = (*f_iter)->getDecodePipeline(pipeline);
            if (decode_pipeline) {
                pipeline = decode_pipeline;
            }
            auto* flate = dynamic_cast<Pl_Flate*>(pipeline);
            if (flate != nullptr) {
                flate->setWarnCallback([this](char const* msg, int code) { warn(msg); });
            }
        }
    }

    if (s->stream_data.get()) {
        QTC::TC("qpdf", "QPDF_Stream pipe replaced stream data");
        pipeline->write(s->stream_data->getBuffer(), s->stream_data->getSize());
        pipeline->finish();
    } else if (s->stream_provider.get()) {
        Pl_Count count("stream provider count", pipeline);
        if (s->stream_provider->supportsRetry()) {
            if (!s->stream_provider->provideStreamData(
                    obj->getObjGen(), &count, suppress_warnings, will_retry)) {
                filter = false;
                success = false;
            }
        } else {
            s->stream_provider->provideStreamData(obj->getObjGen(), &count);
        }
        qpdf_offset_t actual_length = count.getCount();
        qpdf_offset_t desired_length = 0;
        if (success && s->stream_dict.hasKey("/Length")) {
            desired_length = s->stream_dict.getKey("/Length").getIntValue();
            if (actual_length == desired_length) {
                QTC::TC("qpdf", "QPDF_Stream pipe use stream provider");
            } else {
                QTC::TC("qpdf", "QPDF_Stream provider length mismatch");
                // This would be caused by programmer error on the part of a library user, not by
                // invalid input data.
                throw std::runtime_error(
                    "stream data provider for " + obj->getObjGen().unparse(' ') + " provided " +
                    std::to_string(actual_length) + " bytes instead of expected " +
                    std::to_string(desired_length) + " bytes");
            }
        } else if (success) {
            QTC::TC("qpdf", "QPDF_Stream provider length not provided");
            s->stream_dict.replaceKey("/Length", QPDFObjectHandle::newInteger(actual_length));
        }
    } else if (obj->getParsedOffset() == 0) {
        QTC::TC("qpdf", "QPDF_Stream pipe no stream data");
        throw std::logic_error("pipeStreamData called for stream with no data");
    } else {
        QTC::TC("qpdf", "QPDF_Stream pipe original stream data");
        if (!QPDF::Pipe::pipeStreamData(
                obj->getQPDF(),
                obj->getObjGen(),
                obj->getParsedOffset(),
                s->length,
                s->stream_dict,
                isRootMetadata(),
                pipeline,
                suppress_warnings,
                will_retry)) {
            filter = false;
            success = false;
        }
    }

    if (filter && (!suppress_warnings) && normalizer.get() && normalizer->anyBadTokens()) {
        warn("content normalization encountered bad tokens");
        if (normalizer->lastTokenWasBad()) {
            QTC::TC("qpdf", "QPDF_Stream bad token at end during normalize");
            warn(
                "normalized content ended with a bad token; you may be able to resolve this by "
                "coalescing content streams in combination with normalizing content. From the "
                "command line, specify --coalesce-contents");
        }
        warn(
            "Resulting stream data may be corrupted but is may still useful for manual "
            "inspection. For more information on this warning, search for content normalization "
            "in the manual.");
    }

    return success;
}